

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_buffer.cpp
# Opt level: O2

void __thiscall
duckdb::PartialBlockForIndex::Flush(PartialBlockForIndex *this,idx_t free_space_left)

{
  shared_ptr<duckdb::BlockHandle,_true> *old_block;
  BlockManager *block_id;
  undefined1 auStack_38 [40];
  
  PartialBlock::FlushInternal(&this->super_PartialBlock,free_space_left);
  old_block = (shared_ptr<duckdb::BlockHandle,_true> *)(this->super_PartialBlock).state.block_id;
  block_id = (this->super_PartialBlock).block_manager;
  auStack_38._16_8_ =
       (this->super_PartialBlock).block_handle.internal.
       super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  auStack_38._24_8_ =
       (this->super_PartialBlock).block_handle.internal.
       super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_PartialBlock).block_handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PartialBlock).block_handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  BlockManager::ConvertToPersistent((BlockManager *)auStack_38,(block_id_t)block_id,old_block);
  shared_ptr<duckdb::BlockHandle,_true>::operator=
            (&(this->super_PartialBlock).block_handle,
             (shared_ptr<duckdb::BlockHandle,_true> *)auStack_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 8));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_38 + 0x18));
  (*(this->super_PartialBlock)._vptr_PartialBlock[4])(this);
  return;
}

Assistant:

void PartialBlockForIndex::Flush(const idx_t free_space_left) {
	FlushInternal(free_space_left);
	block_handle = block_manager.ConvertToPersistent(state.block_id, std::move(block_handle));
	Clear();
}